

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshComputeChow(word *t,int nVars,int *pChow)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  bVar1 = (byte)nVars & 0x1f;
  iVar6 = 0;
  memset(pChow,0,(long)nVars * 4);
  uVar2 = 0;
  if (0 < nVars) {
    uVar2 = (ulong)(uint)nVars;
  }
  uVar5 = 1 << bVar1;
  if (1 << bVar1 < 1) {
    uVar5 = 0;
  }
  uVar4 = 0;
  while (uVar3 = (uint)uVar4, uVar3 != uVar5) {
    if ((t[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        if ((uVar3 >> ((uint)uVar4 & 0x1f) & 1) != 0) {
          pChow[uVar4] = pChow[uVar4] + 1;
        }
      }
      iVar6 = iVar6 + 1;
    }
    uVar4 = (ulong)(uVar3 + 1);
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    pChow[uVar4] = pChow[uVar4] * 2 - iVar6;
  }
  return iVar6 + (-1 << ((byte)nVars - 1 & 0x1f));
}

Assistant:

int Extra_ThreshComputeChow(word * t, int nVars, int * pChow) {
    int i, k, Chow0 = 0, nMints = (1 << nVars);
    memset(pChow, 0, sizeof(int) * nVars);
    // compute Chow coefs
    for (i = 0; i < nMints; i++)
        if (Abc_TtGetBit(t, i))
            for (Chow0++, k = 0; k < nVars; k++)
                if ((i >> k) & 1)
                    pChow[k]++;
    // compute modified Chow coefs
    for (k = 0; k < nVars; k++)
        pChow[k] = 2 * pChow[k] - Chow0;
    return Chow0 - (1 << (nVars - 1));
}